

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grafmode.c
# Opt level: O2

graphics_mode * get_graphics_mode(uint8_t id)

{
  graphics_mode **ppgVar1;
  
  ppgVar1 = &graphics_modes;
  do {
    ppgVar1 = &((graphics_mode *)ppgVar1)->pNext->pNext;
    if ((graphics_mode *)ppgVar1 == (graphics_mode *)0x0) {
      return (graphics_mode *)ppgVar1;
    }
  } while (((graphics_mode *)ppgVar1)->grafID != id);
  return (graphics_mode *)ppgVar1;
}

Assistant:

graphics_mode *get_graphics_mode(uint8_t id) {
	graphics_mode *test = graphics_modes;
	while (test) {
		if (test->grafID == id) {
			return test;
		}
		test = test->pNext;
	}
	return NULL;
}